

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::IsEnabledVerifier::verifyBoolean
          (IsEnabledVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  ostringstream *this_00;
  char *pcVar1;
  GLboolean GVar2;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  GVar2 = glu::CallLogWrapper::glIsEnabled(&(this->super_StateVerifier).super_CallLogWrapper,name);
  if ((bool)GVar2 != reference) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    pcVar1 = "mapped_ == GL_FALSE";
    if (reference) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar1 + 0xb,8 - (ulong)reference);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void IsEnabledVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	const GLboolean state = glIsEnabled(name);
	const GLboolean expectedGLState = reference ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (reference ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}